

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container.cpp
# Opt level: O0

void mountDirectories(Container *container)

{
  Verbosity VVar1;
  int iVar2;
  runtime_error *prVar3;
  int *piVar4;
  double __x;
  double __x_00;
  string local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  undefined1 local_109;
  string local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  undefined1 local_a1;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_30 [8];
  string containerDir;
  Container *container_local;
  
  containerDir.field_2._8_8_ = container;
  std::__cxx11::string::string(local_30,(string *)&container->dir);
  VVar1 = loguru::current_verbosity_cutoff();
  if (-1 < VVar1) {
    loguru::log(__x);
  }
  iVar2 = mount("proc","/proc","proc",0,(void *)0x0);
  if (iVar2 != 0) {
    local_a1 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    piVar4 = __errno_location();
    std::__cxx11::to_string(&local_a0,*piVar4);
    std::operator+(&local_80,"Mount /proc: FAILED [Errno ",&local_a0);
    std::operator+(&local_60,&local_80,"]");
    std::runtime_error::runtime_error(prVar3,(string *)&local_60);
    local_a1 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar2 = mount("sysfs","/sys","sysfs",0,(void *)0x0);
  if (iVar2 != 0) {
    local_109 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    piVar4 = __errno_location();
    std::__cxx11::to_string(&local_108,*piVar4);
    std::operator+(&local_e8,"Mount /sys: FAILED [Errno ",&local_108);
    std::operator+(&local_c8,&local_e8,"]");
    std::runtime_error::runtime_error(prVar3,(string *)&local_c8);
    local_109 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar2 = mount("tmpfs","/dev","tmpfs",0x1000002,(void *)0x0);
  if (iVar2 == 0) {
    VVar1 = loguru::current_verbosity_cutoff();
    if (-1 < VVar1) {
      loguru::log(__x_00);
    }
    std::__cxx11::string::~string(local_30);
    return;
  }
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  piVar4 = __errno_location();
  std::__cxx11::to_string(&local_170,*piVar4);
  std::operator+(&local_150,"Mount /dev: FAILED [Errno ",&local_170);
  std::operator+(&local_130,&local_150,"]");
  std::runtime_error::runtime_error(prVar3,(string *)&local_130);
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void mountDirectories(Container* container)
{
    std::string containerDir = container->dir;
    LOG_F(INFO, "Mounting directories: proc, sys, dev");

    if (mount("proc", "/proc", "proc", 0, nullptr) != 0)
        throw std::runtime_error("Mount /proc: FAILED [Errno " + std::to_string(errno) + "]");

    if (mount("sysfs", "/sys", "sysfs", 0, nullptr) != 0)
        throw std::runtime_error("Mount /sys: FAILED [Errno " + std::to_string(errno) + "]");

    if (mount("tmpfs", "/dev", "tmpfs", MS_NOSUID | MS_STRICTATIME, nullptr) != 0)
        throw std::runtime_error("Mount /dev: FAILED [Errno " + std::to_string(errno) + "]");

    LOG_F(INFO, "Mounting directories: SUCCESS");
}